

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcOrientedEdge::IfcOrientedEdge(IfcOrientedEdge *this)

{
  IfcOrientedEdge *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x78,"IfcOrientedEdge");
  IfcEdge::IfcEdge(&this->super_IfcEdge,&PTR_construction_vtable_24__00f60c98);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcOrientedEdge,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcOrientedEdge,_2UL> *)
             &(this->super_IfcEdge).field_0x40,&PTR_construction_vtable_24__00f60d10);
  (this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xf60be0;
  *(undefined8 *)&this->field_0x78 = 0xf60c80;
  *(undefined8 *)
   &(this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xf60c08;
  *(undefined8 *)
   &(this->super_IfcEdge).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xf60c30;
  *(undefined8 *)&(this->super_IfcEdge).field_0x40 = 0xf60c58;
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcEdge>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcEdge> *)&(this->super_IfcEdge).field_0x50,
             (LazyObject *)0x0);
  std::__cxx11::string::string((string *)&this->Orientation);
  return;
}

Assistant:

IfcOrientedEdge() : Object("IfcOrientedEdge") {}